

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

nng_err nni_http_handler_init_redirect
                  (nni_http_handler **hpp,char *uri,nng_http_status status,char *where)

{
  nng_http_status nVar1;
  nng_err nVar2;
  nng_http_status *data;
  char *pcVar3;
  nni_http_handler *local_40;
  nni_http_handler *h;
  
  h = (nni_http_handler *)hpp;
  data = (nng_http_status *)nni_zalloc(0x18);
  nVar2 = NNG_ENOMEM;
  if (data != (nng_http_status *)0x0) {
    pcVar3 = nni_strdup(where);
    *(char **)(data + 2) = pcVar3;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = nni_strdup(uri);
      *(char **)(data + 4) = pcVar3;
      if (pcVar3 != (char *)0x0) {
        nVar1 = NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY;
        if (status != 0) {
          nVar1 = status;
        }
        *data = nVar1;
        nVar2 = nni_http_handler_init(&local_40,uri,http_handle_redirect);
        if (nVar2 == NNG_OK) {
          nni_http_handler_set_method(local_40,(char *)0x0);
          nni_http_handler_set_data(local_40,data,http_redirect_free);
          local_40->getbody = false;
          local_40->maxbody = 0;
          (h->node).ln_next = &local_40->node;
          return NNG_OK;
        }
      }
    }
    http_redirect_free(data);
  }
  return nVar2;
}

Assistant:

nng_err
nni_http_handler_init_redirect(nni_http_handler **hpp, const char *uri,
    nng_http_status status, const char *where)
{
	nni_http_handler *h;
	nng_err           rv;
	http_redirect    *hr;

	if ((hr = NNI_ALLOC_STRUCT(hr)) == NULL) {
		return (NNG_ENOMEM);
	}
	if (((hr->where = nni_strdup(where)) == NULL) ||
	    ((hr->from = nni_strdup(uri)) == NULL)) {
		http_redirect_free(hr);
		return (NNG_ENOMEM);
	}
	if (status == 0) {
		status = NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY;
	}
	hr->code = status;

	if ((rv = nni_http_handler_init(&h, uri, http_handle_redirect)) != 0) {
		http_redirect_free(hr);
		return (rv);
	}

	nni_http_handler_set_method(h, NULL);

	nni_http_handler_set_data(h, hr, http_redirect_free);

	// We don't need to collect the body at all, because the handler
	// just discards the content and closes the connection.
	nni_http_handler_collect_body(h, false, 0);

	*hpp = h;
	return (NNG_OK);
}